

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::environmentquestion(Forth *this)

{
  uint uVar1;
  int iVar2;
  double x;
  uint local_50;
  Cell ret;
  undefined1 local_40 [8];
  string currentWord;
  CAddr caddr;
  size_t length;
  Forth *this_local;
  
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  currentWord.field_2._12_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  std::__cxx11::string::string((string *)local_40);
  moveFromDataSpace(this,(string *)local_40,currentWord.field_2._12_4_,(ulong)uVar1);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     "/COUNTED-STRING");
  if (iVar2 == 0) {
    local_50 = 0xff;
  }
  else {
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                       ,"/HOLD");
    if (iVar2 == 0) {
      local_50 = 0xff;
    }
    else {
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                      "ADDRESS-UNIT-BITS");
      if (iVar2 == 0) {
        local_50 = 0x20;
      }
      else {
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_40,"FLOORED");
        if (iVar2 == 0) {
          local_50 = this->False;
        }
        else {
          iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"RETURN-STACK-CELLS");
          if (iVar2 == 0) {
            local_50 = 100;
          }
          else {
            iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"STACK-CELLS");
            if (iVar2 == 0) {
              local_50 = 200;
            }
            else {
              iVar2 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_40,"CORE");
              if (iVar2 == 0) {
                local_50 = this->True;
              }
              else {
                iVar2 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_40,"EXCEPTION");
                if (iVar2 == 0) {
                  local_50 = this->True;
                }
                else {
                  iVar2 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_40,"FLOATING");
                  if (iVar2 == 0) {
                    local_50 = this->True;
                  }
                  else {
                    iVar2 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"WORDLISTS");
                    if (iVar2 == 0) {
                      local_50 = 0x100;
                    }
                    else {
                      iVar2 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_40,"#LOCALS");
                      if (iVar2 == 0) {
                        local_50 = 0x100;
                      }
                      else {
                        iVar2 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_40,"FLOATING-STACK");
                        if (iVar2 == 0) {
                          local_50 = 200;
                        }
                        else {
                          iVar2 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_40,"FLOATING");
                          if (iVar2 == 0) {
                            local_50 = 200;
                          }
                          else {
                            iVar2 = std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_40,"MAX-FLOAT");
                            if (iVar2 != 0) {
                              ForthStack<unsigned_int>::setTop(&this->dStack,this->False);
                              goto LAB_00120303;
                            }
                            local_50 = this->True;
                            x = std::numeric_limits<double>::max();
                            ForthStack<double>::push(&this->fStack,x);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,local_50);
  ForthStack<unsigned_int>::push(&this->dStack,this->True);
LAB_00120303:
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void environmentquestion(){
			auto length = SIZE_T(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop());
			std::string currentWord{};
			moveFromDataSpace(currentWord, caddr, length);
			Cell ret = False;
			if (currentWord.compare("/COUNTED-STRING") == 0){
				ret = 255;
			} else 
			if (currentWord.compare("/HOLD") == 0){
					ret = 255;
			}
				else
			if (currentWord.compare("ADDRESS-UNIT-BITS") == 0){
						ret = sizeof(Cell)*8;
					}
					else
						if (currentWord.compare("FLOORED") == 0){
							ret = False;
						}
						else
							if (currentWord.compare("RETURN-STACK-CELLS") == 0){
								ret = 100;
							}
							else
								if (currentWord.compare("STACK-CELLS") == 0){
									ret = 200;
								}
								else
									if (currentWord.compare("CORE") == 0){
										ret = True;
									}
									else
										if (currentWord.compare("EXCEPTION") == 0){
											ret = True;
										}
										else
											if (currentWord.compare("FLOATING") == 0){
												ret = True;
											} 
										else
											if (currentWord.compare("WORDLISTS") == 0){
												ret = 256;
											} 
										else
											if (currentWord.compare("#LOCALS") == 0){
												ret = 256;
											} 

#ifdef FORTHSCRIPTCPP_ENABLE_FLOAT
			else if (currentWord.compare("FLOATING-STACK") == 0){
				ret = 200;
			}else if (currentWord.compare("FLOATING") == 0){
				ret = 200;
			} else
			if (currentWord.compare("MAX-FLOAT") == 0){
				ret = True;
				fStack.push(std::numeric_limits<FCell>::max());
			}
#endif
			else {
				dStack.setTop(False);
				return;
			}